

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_CreateLevel(Vec_Wec_t *vFanins,Vec_Int_t *vLevels,Vec_Str_t *vEmpty)

{
  int iVar1;
  Vec_Int_t *vArray_00;
  int local_2c;
  int i;
  Vec_Int_t *vArray;
  Vec_Str_t *vEmpty_local;
  Vec_Int_t *vLevels_local;
  Vec_Wec_t *vFanins_local;
  
  iVar1 = Vec_IntSize(vLevels);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(vLevels) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x7a,"void Sfm_CreateLevel(Vec_Wec_t *, Vec_Int_t *, Vec_Str_t *)");
  }
  iVar1 = Vec_WecSize(vFanins);
  Vec_IntFill(vLevels,iVar1,0);
  for (local_2c = 0; iVar1 = Vec_WecSize(vFanins), local_2c < iVar1; local_2c = local_2c + 1) {
    vArray_00 = Vec_WecEntry(vFanins,local_2c);
    iVar1 = Sfm_ObjAddsLevelArray(vEmpty,local_2c);
    iVar1 = Sfm_ObjLevelNew(vArray_00,vLevels,iVar1);
    Vec_IntWriteEntry(vLevels,local_2c,iVar1);
  }
  return;
}

Assistant:

void Sfm_CreateLevel( Vec_Wec_t * vFanins, Vec_Int_t * vLevels, Vec_Str_t * vEmpty )
{
    Vec_Int_t * vArray;
    int i;
    assert( Vec_IntSize(vLevels) == 0 );
    Vec_IntFill( vLevels, Vec_WecSize(vFanins), 0 );
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntWriteEntry( vLevels, i, Sfm_ObjLevelNew(vArray, vLevels, Sfm_ObjAddsLevelArray(vEmpty, i)) );
}